

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O2

RingBuffer<std::function<void_()>_*> * __thiscall
quickpool::sched::RingBuffer<std::function<void_()>_*>::enlarged_copy
          (RingBuffer<std::function<void_()>_*> *this,size_t bottom,size_t top)

{
  ulong uVar1;
  RingBuffer<std::function<void_()>_*> *this_00;
  size_t i;
  
  this_00 = (RingBuffer<std::function<void_()>_*> *)operator_new(0x18);
  RingBuffer(this_00,this->capacity_ * 2);
  uVar1 = this->mask_;
  for (; bottom != top; top = top + 1) {
    (this_00->buffer_)._M_t.
    super___uniq_ptr_impl<std::function<void_()>_*,_std::default_delete<std::function<void_()>_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::function<void_()>_**,_std::default_delete<std::function<void_()>_*[]>_>
    .super__Head_base<0UL,_std::function<void_()>_**,_false>._M_head_impl[this_00->mask_ & top] =
         (this->buffer_)._M_t.
         super___uniq_ptr_impl<std::function<void_()>_*,_std::default_delete<std::function<void_()>_*[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::function<void_()>_**,_std::default_delete<std::function<void_()>_*[]>_>
         .super__Head_base<0UL,_std::function<void_()>_**,_false>._M_head_impl[uVar1 & top];
  }
  return this_00;
}

Assistant:

RingBuffer<T>* enlarged_copy(size_t bottom, size_t top) const
    {
        RingBuffer<T>* new_buffer = new RingBuffer{ 2 * capacity_ };
        for (size_t i = top; i != bottom; ++i)
            new_buffer->set_entry(i, this->get_entry(i));
        return new_buffer;
    }